

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppunfix5.h
# Opt level: O2

void __thiscall pointprocess::poissonprocess(pointprocess *this,double intensity)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->k;
  if (this->k < 1) {
    uVar2 = uVar3;
  }
  dVar6 = 1.0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar6 = dVar6 * this->akse[uVar3];
  }
  dVar4 = drand48();
  dVar5 = exp(-(dVar6 * intensity));
  iVar1 = 0;
  dVar7 = dVar5;
  for (; dVar5 <= dVar4; dVar5 = dVar5 + dVar7) {
    iVar1 = iVar1 + 1;
    dVar7 = dVar7 * ((dVar6 * intensity) / (double)iVar1);
  }
  this->n = iVar1;
  binoprocess(this);
  return;
}

Assistant:

void pointprocess :: poissonprocess ( double intensity )
{
  double areaS = 1;
  int i;
  for ( i = 0; i < k; i++ )
    areaS *= akse[i];         // AREA/VOLUME OF OBSERVATION WINDOW S

  n = poisson(intensity*areaS); // ANT PKTER ER POISSON FORDELT
  binoprocess();
}